

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O2

optional<NFastBernoulli::TExecutionPlan> *
NFastBernoulli::Quantize
          (optional<NFastBernoulli::TExecutionPlan> *__return_storage_ptr__,double prob,double tol)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 local_58 [32];
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  size_t sStack_18;
  size_t sStack_10;
  
  uStack_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_58 = ZEXT1632(ZEXT816(0) << 0x40);
  dVar6 = 0.0;
  sStack_10 = 1;
  sStack_18 = 0;
  dVar7 = 1.0;
  lVar4 = 0;
  do {
    if (0x3e < lVar4) {
      bVar3 = false;
LAB_00103513:
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged = bVar3;
      return __return_storage_ptr__;
    }
    if ((prob - dVar6 <= tol) && (dVar7 - prob <= tol)) {
LAB_001034d7:
      std::__reverse<NFastBernoulli::EOp*>(local_58,local_58 + sStack_18);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x30) =
           local_28;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x38) =
           uStack_20;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
      NoOps_ = sStack_18;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
      NoSrcBlocks_ = sStack_10;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x20) =
           uStack_38;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x28) =
           uStack_30;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x30) =
           local_28;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x38) =
           uStack_20;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
        _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload =
           local_58._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 8) =
           local_58._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x10) =
           local_58._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x18) =
           local_58._24_8_;
      bVar3 = true;
      goto LAB_00103513;
    }
    dVar2 = (dVar7 - dVar6) * 0.5 + dVar6;
    if ((dVar2 == prob) && (!NAN(dVar2) && !NAN(prob))) goto LAB_001034d7;
    lVar1 = lVar4 + 1;
    if (prob <= dVar2) {
      lVar5 = lVar4;
      if (dVar2 <= prob) {
        dVar2 = dVar7;
      }
    }
    else {
      local_58[lVar4] = 0;
      sStack_18 = sStack_18 + 1;
      prob = 1.0 - prob;
      dVar6 = 1.0 - dVar7;
      lVar5 = lVar1;
      lVar1 = lVar4 + 2;
      dVar2 = 1.0 - dVar2;
    }
    dVar7 = dVar2;
    lVar4 = lVar1;
    local_58[lVar5] = 1;
    sStack_18 = sStack_18 + 1;
    sStack_10 = sStack_10 + 1;
  } while( true );
}

Assistant:

std::optional<TExecutionPlan> Quantize(double prob, double tol) noexcept {
    TExecutionPlan plan{.NoSrcBlocks_ = 1};
    double lhs = 0.0, rhs = 1.0;
    for (auto it = plan.Ops_.begin(); it + 1 < plan.Ops_.end(); ++it) {
        if (prob - lhs <= tol && rhs - prob <= tol) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        }

        double mid = lhs + 0.5 * (rhs - lhs);

        if (mid == prob) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        } else if (prob > mid) {
            *(it++) = EOp::Not;
            ++plan.NoOps_;
            prob = 1 - prob;
            lhs = 1 - rhs;
            rhs = 1 - mid;
        } else if (prob < mid) {
            rhs = mid;
        }

        // In any case append AND operation.
        *it = EOp::And;
        ++plan.NoOps_;
        ++plan.NoSrcBlocks_;
    }
    return std::nullopt;
}